

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::PrintGeneratorList(cmake *this)

{
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  cmDocumentation doc;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> vStack_c8;
  cmDocumentation local_b0;
  
  cmDocumentation::cmDocumentation(&local_b0);
  GetGeneratorsDocumentation(&vStack_c8,this);
  cmDocumentation::AppendSection(&local_b0,"Generators",&vStack_c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  cmDocumentation::PrintDocumentation(&local_b0,ListGenerators,(ostream *)&std::cerr);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&vStack_c8);
  cmDocumentationFormatter::~cmDocumentationFormatter(&local_b0.Formatter);
  std::
  vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>::
  ~vector(&local_b0.RequestedHelpItems);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.CurrentArgument._M_dataplus._M_p != &local_b0.CurrentArgument.field_2) {
    operator_delete(local_b0.CurrentArgument._M_dataplus._M_p,
                    local_b0.CurrentArgument.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>_>
  ::~_Rb_tree(&local_b0.AllSections._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.NameString._M_dataplus._M_p != &local_b0.NameString.field_2) {
    operator_delete(local_b0.NameString._M_dataplus._M_p,
                    local_b0.NameString.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmake::PrintGeneratorList()
{
#ifndef CMAKE_BOOTSTRAP
  cmDocumentation doc;
  auto generators = this->GetGeneratorsDocumentation();
  doc.AppendSection("Generators", generators);
  std::cerr << "\n";
  doc.PrintDocumentation(cmDocumentation::ListGenerators, std::cerr);
#endif
}